

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertStrUtil.cpp
# Opt level: O3

string * lzstring::to_string(string *__return_storage_ptr__,wstring *src)

{
  pointer pcVar1;
  size_t sVar2;
  vector<char,_std::allocator<char>_> tmp;
  allocator_type local_31;
  vector<char,_std::allocator<char>_> local_30;
  
  setlocale(0,"");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar2 = wcstombs((char *)0x0,(src->_M_dataplus)._M_p,0);
  std::vector<char,_std::allocator<char>_>::vector(&local_30,sVar2 + 1,&local_31);
  wcstombs(local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start,(src->_M_dataplus)._M_p,
           (long)local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  std::__cxx11::string::
  _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + __return_storage_ptr__->_M_string_length,
             local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish + -1);
  if (local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(std::wstring const &src)
{
    std::setlocale(LC_CTYPE, "");

    std::string dest;
    size_t const mbs_len = wcstombs(NULL, src.c_str(), 0);
    std::vector<char> tmp(mbs_len + 1);
    wcstombs(&tmp[0], src.c_str(), tmp.size());

    dest.assign(tmp.begin(), tmp.end() - 1);

    return dest;
}